

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O2

int Abc_NtkMiterSatCreateInt(sat_solver *pSat,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vVars;
  Abc_Obj_t *pNodeC;
  void *pvVar3;
  int iVar4;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x1de,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
  }
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar4);
    (pAVar2->field_6).pTemp = (void *)0x0;
  }
  p = Vec_PtrAlloc(1000);
  vNodes = Vec_PtrAlloc(100);
  vVars = Vec_IntAlloc(100);
  pAVar2 = Abc_AigConst1(pNtk);
  pAVar2->field_0x14 = pAVar2->field_0x14 | 0x10;
  pAVar2->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)p->nSize;
  Vec_PtrPush(p,pAVar2);
  Abc_NtkClauseTriv(pSat,pAVar2,vVars);
  vNodes->nSize = 0;
  iVar4 = 0;
  while( true ) {
    if (pNtk->vCos->nSize <= iVar4) break;
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCos,iVar4);
    pvVar3 = pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
    if ((*(uint *)((long)pvVar3 + 0x14) & 0x10) == 0) {
      *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x10;
      *(long *)((long)pvVar3 + 0x40) = (long)p->nSize;
      Vec_PtrPush(p,pvVar3);
    }
    pAVar2 = Abc_ObjChild0(pAVar2);
    Vec_PtrPush(vNodes,pAVar2);
    iVar4 = iVar4 + 1;
  }
  iVar4 = Abc_NtkClauseTop(pSat,vNodes,vVars);
  if (iVar4 == 0) {
LAB_002b9422:
    iVar4 = 0;
  }
  else {
    for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar4);
      if (((ulong)pAVar2 & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                      ,0x20f,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
      }
      if (pAVar2->pNtk->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if ((pAVar2->vFanins).nSize == 2) {
        iVar1 = Abc_NodeIsMuxType(pAVar2);
        if (iVar1 == 0) {
          Abc_NtkCollectSupergate(pAVar2,1,vNodes);
          iVar1 = 0;
          while( true ) {
            if (vNodes->nSize <= iVar1) break;
            pvVar3 = Vec_PtrEntry(vNodes,iVar1);
            pvVar3 = (void *)((ulong)pvVar3 & 0xfffffffffffffffe);
            if ((*(uint *)((long)pvVar3 + 0x14) & 0x10) == 0) {
              *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x10;
              *(long *)((long)pvVar3 + 0x40) = (long)p->nSize;
              Vec_PtrPush(p,pvVar3);
            }
            iVar1 = iVar1 + 1;
          }
          if (vNodes->nSize == 0) {
            iVar1 = Abc_NtkClauseTriv(pSat,(Abc_Obj_t *)((ulong)pAVar2 | 1),vVars);
          }
          else {
            iVar1 = Abc_NtkClauseAnd(pSat,pAVar2,vNodes,vVars);
          }
        }
        else {
          nMuxes = nMuxes + 1;
          pNodeC = Abc_NodeRecognizeMux(pAVar2,&pNodeT,&pNodeE);
          vNodes->nSize = 0;
          Vec_PtrPush(vNodes,pNodeC);
          Vec_PtrPush(vNodes,pNodeT);
          Vec_PtrPush(vNodes,pNodeE);
          for (iVar1 = 0; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
            pvVar3 = Vec_PtrEntry(vNodes,iVar1);
            pvVar3 = (void *)((ulong)pvVar3 & 0xfffffffffffffffe);
            if ((*(uint *)((long)pvVar3 + 0x14) & 0x10) == 0) {
              *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x10;
              *(long *)((long)pvVar3 + 0x40) = (long)p->nSize;
              Vec_PtrPush(p,pvVar3);
            }
          }
          iVar1 = Abc_NtkClauseMux(pSat,pAVar2,pNodeC,pNodeT,pNodeE,vVars);
        }
        if (iVar1 == 0) goto LAB_002b9422;
      }
    }
    iVar4 = 1;
  }
  Vec_IntFree(vVars);
  Vec_PtrFree(p);
  Vec_PtrFree(vNodes);
  return iVar4;
}

Assistant:

int Abc_NtkMiterSatCreateInt( sat_solver * pSat, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin, * pNodeC, * pNodeT, * pNodeE;
    Vec_Ptr_t * vNodes, * vSuper;
    Vec_Int_t * vVars;
    int i, k, fUseMuxes = 1;
//    int fOrderCiVarsFirst = 0;
    int RetValue = 0;

    assert( Abc_NtkIsStrash(pNtk) );

    // clean the CI node pointers
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;

    // start the data structures
    vNodes  = Vec_PtrAlloc( 1000 );   // the nodes corresponding to vars in the sat_solver
    vSuper  = Vec_PtrAlloc( 100 );    // the nodes belonging to the given implication supergate
    vVars   = Vec_IntAlloc( 100 );    // the temporary array for variables in the clause

    // add the clause for the constant node
    pNode = Abc_AigConst1(pNtk);
    pNode->fMarkA = 1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
    Vec_PtrPush( vNodes, pNode );
    Abc_NtkClauseTriv( pSat, pNode, vVars );
/*
    // add the PI variables first
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->fMarkA = 1;
        pNode->pCopy = (Abc_Obj_t *)vNodes->nSize;
        Vec_PtrPush( vNodes, pNode );
    }
*/
    // collect the nodes that need clauses and top-level assignments
    Vec_PtrClear( vSuper );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // get the fanin
        pFanin = Abc_ObjFanin0(pNode);
        // create the node's variable
        if ( pFanin->fMarkA == 0 )
        {
            pFanin->fMarkA = 1;
            pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
            Vec_PtrPush( vNodes, pFanin );
        }
        // add the trivial clause
        Vec_PtrPush( vSuper, Abc_ObjChild0(pNode) );
    }
    if ( !Abc_NtkClauseTop( pSat, vSuper, vVars ) )
        goto Quits;


    // add the clauses
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( !Abc_ObjIsComplement(pNode) );
        if ( !Abc_AigNodeIsAnd(pNode) )
            continue;
//printf( "%d ", pNode->Id );

        // add the clauses
        if ( fUseMuxes && Abc_NodeIsMuxType(pNode) )
        {
            nMuxes++;

            pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
            Vec_PtrClear( vSuper );
            Vec_PtrPush( vSuper, pNodeC );
            Vec_PtrPush( vSuper, pNodeT );
            Vec_PtrPush( vSuper, pNodeE );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( !Abc_NtkClauseMux( pSat, pNode, pNodeC, pNodeT, pNodeE, vVars ) )
                goto Quits;
        }
        else
        {
            // get the supergate
            Abc_NtkCollectSupergate( pNode, fUseMuxes, vSuper );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( vSuper->nSize == 0 )
            {
                if ( !Abc_NtkClauseTriv( pSat, Abc_ObjNot(pNode), vVars ) )
//                if ( !Abc_NtkClauseTriv( pSat, pNode, vVars ) )
                    goto Quits;
            }
            else
            {
                if ( !Abc_NtkClauseAnd( pSat, pNode, vSuper, vVars ) )
                    goto Quits;
            }
        }
    }
/*
    // set preferred variables
    if ( fOrderCiVarsFirst )
    {
        int * pPrefVars = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        int nVars = 0;
        Abc_NtkForEachCi( pNtk, pNode, i )
        {
            if ( pNode->fMarkA == 0 )
                continue;
            pPrefVars[nVars++] = (int)pNode->pCopy;
        }
        nVars = Abc_MinInt( nVars, 10 );
        ASat_SolverSetPrefVars( pSat, pPrefVars, nVars );
    }
*/
/*
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        if ( !pNode->fMarkA )
            continue;
        printf( "%10s : ", Abc_ObjName(pNode) );
        printf( "%3d\n", (int)pNode->pCopy );
    }
    printf( "\n" );
*/
    RetValue = 1;
Quits :
    // delete
    Vec_IntFree( vVars );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vSuper );
    return RetValue;
}